

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O0

void __thiscall Assimp::AC3DImporter::Object::Object(Object *this,Object *param_1)

{
  uint uVar1;
  Object *param_1_local;
  Object *this_local;
  
  this->type = param_1->type;
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::vector
            (&this->children,&param_1->children);
  std::__cxx11::string::string((string *)&this->texture,(string *)&param_1->texture);
  memcpy(&this->texRepeat,&param_1->texRepeat,0x40);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&this->vertices,&param_1->vertices);
  std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::vector
            (&this->surfaces,&param_1->surfaces);
  uVar1 = param_1->subDiv;
  this->numRefs = param_1->numRefs;
  this->subDiv = uVar1;
  this->crease = param_1->crease;
  return;
}

Assistant:

Object()
            :   type    (World)
            ,   name( "" )
            ,   children()
            ,   texture( "" )
            ,   texRepeat( 1.f, 1.f )
            ,   texOffset( 0.0f, 0.0f )
            ,   rotation()
            ,   translation()
            ,   vertices()
            ,   surfaces()
            ,   numRefs (0)
            ,   subDiv  (0)
            ,   crease()
        {}